

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_json_encode_test.c
# Opt level: O0

_Bool uo_json_encode_number_test(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  bool bVar7;
  _Bool f;
  _Bool t;
  char *end;
  _Bool passed;
  
  pcVar6 = uo_json_encode_int64(json,1);
  *pcVar6 = '\0';
  iVar1 = strcmp(json,"1");
  pcVar6 = uo_json_encode_double(json,1.234);
  *pcVar6 = '\0';
  iVar2 = strcmp(json,"1.234");
  pcVar6 = uo_json_encode_double(json,1e-05);
  *pcVar6 = '\0';
  iVar3 = strcmp(json,"1e-05");
  bVar7 = true;
  if (iVar3 != 0) {
    iVar3 = strcmp(json,"1e-005");
    bVar7 = iVar3 == 0;
  }
  pcVar6 = uo_json_encode_int64(json,-100000000000);
  *pcVar6 = '\0';
  iVar3 = strcmp(json,"-100000000000");
  pcVar6 = uo_json_encode_bool(json,true);
  *pcVar6 = '\0';
  iVar4 = strcmp(json,"true");
  pcVar6 = uo_json_encode_bool(json,false);
  *pcVar6 = '\0';
  iVar5 = strcmp(json,"false");
  return (((bool)((iVar1 == 0 && iVar2 == 0) & bVar7) && iVar3 == 0) && iVar4 == 0) && iVar5 == 0;
}

Assistant:

bool uo_json_encode_number_test(void)
{
    bool passed = true;
    char *end;

    end = uo_json_encode(json, 1);
    *end = '\0';
    passed &= strcmp(json, "1") == 0;

    end = uo_json_encode(json, 1.234);
    *end = '\0';
    passed &= strcmp(json, "1.234") == 0;

    end = uo_json_encode(json, 0.00001);
    *end = '\0';
    passed &= (strcmp(json, "1e-05") == 0 || strcmp(json, "1e-005") == 0);

    end = uo_json_encode(json, -100000000000);
    *end = '\0';
    passed &= strcmp(json, "-100000000000") == 0;

    bool t = true;
    end = uo_json_encode(json, t);
    *end = '\0';
    passed &= strcmp(json, "true") == 0;

    bool f = false;
    end = uo_json_encode(json, f);
    *end = '\0';
    passed &= strcmp(json, "false") == 0;

    return passed;
}